

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O3

void __thiscall
tinyusdz::
TypedTimeSamples<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>
::add_blocked_sample
          (TypedTimeSamples<std::vector<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>_>
           *this,double t)

{
  Sample s;
  Sample local_40;
  
  local_40.value.
  super__Vector_base<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_40.value.
  super__Vector_base<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_40.value.
  super__Vector_base<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_40.blocked = true;
  local_40.t = t;
  ::std::
  vector<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::point3f,std::allocator<tinyusdz::value::point3f>>>::Sample,std::allocator<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::point3f,std::allocator<tinyusdz::value::point3f>>>::Sample>>
  ::
  emplace_back<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::point3f,std::allocator<tinyusdz::value::point3f>>>::Sample&>
            ((vector<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::point3f,std::allocator<tinyusdz::value::point3f>>>::Sample,std::allocator<tinyusdz::TypedTimeSamples<std::vector<tinyusdz::value::point3f,std::allocator<tinyusdz::value::point3f>>>::Sample>>
              *)this,&local_40);
  this->_dirty = true;
  if (local_40.value.
      super__Vector_base<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_40.value.
                    super__Vector_base<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_40.value.
                          super__Vector_base<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.value.
                          super__Vector_base<tinyusdz::value::point3f,_std::allocator<tinyusdz::value::point3f>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void add_blocked_sample(const double t) {
    Sample s;
    s.t = t;
    s.blocked = true;
    _samples.emplace_back(s);
    _dirty = true;
  }